

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O2

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 (*pauVar6) [16];
  float *pfVar7;
  float fVar8;
  undefined1 auVar9 [32];
  ulong uVar10;
  ulong uVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  byte *pbVar14;
  int iVar15;
  size_t i_1;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  undefined4 uVar19;
  undefined1 (*pauVar20) [16];
  byte *pbVar21;
  long lVar22;
  float *pfVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar28 [16];
  undefined1 in_XMM8 [16];
  
  auVar9 = _DAT_0015e220;
  iVar3 = iimage->height;
  iVar4 = iimage->width;
  uVar11 = (ulong)iVar4;
  iVar5 = iimage->data_width;
  lVar18 = (long)iVar5;
  pauVar6 = (undefined1 (*) [16])iimage->data;
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  uVar10 = (ulong)(iVar4 / 4 << 2);
  for (uVar12 = 0; uVar12 < uVar10; uVar12 = uVar12 + 4) {
    auVar26 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar9,
                                ZEXT432(*(uint *)(gray_image + uVar12)));
    auVar26 = vpsadbw_avx2(auVar26,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar26 = vpaddd_avx2(auVar26,auVar27._0_32_);
    auVar24 = vpmovqd_avx512vl(auVar26);
    *(undefined1 (*) [16])(*pauVar6 + uVar12 * 4) = auVar24;
    auVar26 = vpermq_avx2(auVar26,0xff);
    auVar27 = ZEXT3264(auVar26);
  }
  iVar15 = *(int *)(pauVar6[-1] + uVar12 * 4 + 0xc);
  for (; uVar12 < uVar11; uVar12 = uVar12 + 1) {
    iVar15 = iVar15 + (uint)gray_image[uVar12];
    *(int *)(*pauVar6 + uVar12 * 4) = iVar15;
  }
  pfVar7 = iimage->data;
  lVar1 = lVar18 * 4;
  pbVar14 = gray_image + uVar11;
  lVar22 = 0;
  pauVar17 = pauVar6;
  pfVar23 = pfVar7;
  for (uVar12 = 1; uVar12 < (ulong)(long)iVar3; uVar12 = uVar12 + 1) {
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    lVar13 = lVar22;
    pauVar20 = pauVar17;
    pbVar21 = pbVar14;
    for (uVar16 = 0; uVar16 < uVar10; uVar16 = uVar16 + 4) {
      lVar13 = lVar13 + 0x10;
      pbVar21 = pbVar21 + 4;
      auVar26 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar9,
                                  ZEXT432(*(uint *)(pbVar14 + uVar16)));
      auVar26 = vpsadbw_avx2(auVar26,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar26 = vpaddd_avx2(auVar26,auVar27._0_32_);
      auVar25 = vpmovqd_avx512vl(auVar26);
      auVar26 = vpermq_avx2(auVar26,0xff);
      auVar27 = ZEXT3264(auVar26);
      auVar24 = vcvtdq2ps_avx(*pauVar20);
      auVar25 = vpaddd_avx(*pauVar20,auVar25);
      in_ZMM5 = ZEXT1664(auVar25);
      auVar28._0_4_ = auVar24._0_4_ * 0.003921569;
      auVar28._4_4_ = auVar24._4_4_ * 0.003921569;
      auVar28._8_4_ = auVar24._8_4_ * 0.003921569;
      auVar28._12_4_ = auVar24._12_4_ * 0.003921569;
      *(undefined1 (*) [16])(pfVar23 + uVar16) = auVar28;
      *(undefined1 (*) [16])(*pauVar20 + lVar1) = auVar25;
      pauVar20 = pauVar20 + 1;
    }
    iVar15 = *(int *)(pauVar20[-1] + lVar1 + 0xc) - *(int *)(pauVar20[-1] + 0xc);
    while (uVar16 < uVar11) {
      auVar24 = vcvtusi2ss_avx512f(in_XMM8,*(undefined4 *)(*pauVar6 + lVar13));
      bVar2 = *pbVar21;
      uVar16 = uVar16 + 1;
      pbVar21 = pbVar21 + 1;
      iVar15 = iVar15 + (uint)bVar2;
      auVar25 = vcvtusi2ss_avx512f(in_XMM8,iVar15);
      fVar8 = auVar24._0_4_ + auVar25._0_4_;
      in_ZMM5 = ZEXT464((uint)fVar8);
      uVar19 = vcvttss2usi_avx512f(ZEXT416((uint)fVar8));
      *(undefined4 *)(*pauVar6 + lVar13 + lVar18 * 4) = uVar19;
      *(float *)((long)pfVar7 + lVar13) = auVar24._0_4_ * 0.003921569;
      lVar13 = lVar13 + 4;
    }
    pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar1);
    pbVar14 = pbVar14 + uVar11;
    pfVar23 = pfVar23 + lVar18;
    lVar22 = lVar22 + lVar1;
  }
  lVar18 = (long)((iVar3 + -1) * iVar5);
  for (uVar10 = 0; uVar10 < (ulong)(long)(iVar4 + -7); uVar10 = uVar10 + 8) {
    auVar9 = vcvtdq2ps_avx(*(undefined1 (*) [32])(*pauVar6 + uVar10 * 4 + lVar18 * 4));
    pfVar23 = pfVar7 + lVar18 + uVar10;
    *pfVar23 = auVar9._0_4_ * 0.003921569;
    pfVar23[1] = auVar9._4_4_ * 0.003921569;
    pfVar23[2] = auVar9._8_4_ * 0.003921569;
    pfVar23[3] = auVar9._12_4_ * 0.003921569;
    pfVar23[4] = auVar9._16_4_ * 0.003921569;
    pfVar23[5] = auVar9._20_4_ * 0.003921569;
    pfVar23[6] = auVar9._24_4_ * 0.003921569;
    pfVar23[7] = auVar9._28_4_;
  }
  for (; uVar10 < uVar11; uVar10 = uVar10 + 1) {
    auVar24 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,*(undefined4 *)(*pauVar6 + uVar10 * 4 + lVar18 * 4))
    ;
    pfVar7[lVar18 + uVar10] = auVar24._0_4_ * 0.003921569;
  }
  return;
}

Assistant:

void compute_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    float *iimage_data = iimage->data;
    __m128 factor = _mm_set1_ps(1.0f / 255.0f);

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // AVX512 only :(
            //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
            __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
            //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

            // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
            __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

            // Storing float of previous row sum back to memory as final integral image value
            _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            float prev_row_sum = iimage_idata[(j-1) * data_width + i];
            iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
            iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
        }

    }

    // Converting last row to floats
    __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
    size_t i = 0;
    for (; i < width - 7; i+=8) {

        __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
        //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

        // AVX512 only :(
        //__m256 v_float = _mm256_cvtepu32_ps(v_int);
        __m256 v_float = _mm256_cvtepi32_ps(v_int);
        //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

        // Multiplying converted float with (1.0f/255.0f) 
        __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

        // Storing value back to memory
        _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

    } 

    for (; i < width; ++i) {
        iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
    }

}